

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertex
               (VertexAttribute *src,VertexAttribute *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,string *err,
               float eps)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t sVar4;
  uchar *puVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  uchar *puVar7;
  size_type sVar8;
  float *pfVar9;
  array<float,_2UL> *paVar10;
  array<float,_3UL> *paVar11;
  array<float,_4UL> *paVar12;
  char *pcVar13;
  short *psVar14;
  unsigned_short *puVar15;
  half *phVar16;
  array<tinyusdz::value::half,_2UL> *paVar17;
  array<tinyusdz::value::half,_3UL> *paVar18;
  array<tinyusdz::value::half,_4UL> *paVar19;
  int *piVar20;
  array<int,_2UL> *paVar21;
  array<int,_3UL> *paVar22;
  array<int,_4UL> *paVar23;
  uint *puVar24;
  array<unsigned_int,_2UL> *paVar25;
  array<unsigned_int,_3UL> *paVar26;
  array<unsigned_int,_4UL> *paVar27;
  double *pdVar28;
  array<double,_2UL> *paVar29;
  array<double,_3UL> *paVar30;
  array<double,_4UL> *paVar31;
  matrix2f *pmVar32;
  matrix3f *pmVar33;
  matrix4f *pmVar34;
  matrix2d *pmVar35;
  matrix3d *pmVar36;
  matrix4d *pmVar37;
  VertexAttributeFormat f;
  string local_dc8;
  allocator local_da1;
  string local_da0 [32];
  fmt local_d80 [39];
  undefined1 local_d59;
  undefined1 local_d58 [7];
  bool ret_30;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> vdst_30;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> vsrc_30;
  undefined1 local_d20 [7];
  bool ret_29;
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> vdst_29;
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> vsrc_29;
  undefined1 local_ce8 [7];
  bool ret_28;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> vdst_28;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> vsrc_28;
  undefined1 local_cb0 [7];
  bool ret_27;
  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> vdst_27;
  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> vsrc_27;
  undefined1 local_c78 [7];
  bool ret_26;
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> vdst_26;
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> vsrc_26;
  undefined1 local_c40 [7];
  bool ret_25;
  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> vdst_25;
  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> vsrc_25;
  undefined1 local_c08 [7];
  bool ret_24;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> vdst_24;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> vsrc_24;
  undefined1 local_bd0 [7];
  bool ret_23;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> vdst_23;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> vsrc_23;
  undefined1 local_b98 [7];
  bool ret_22;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> vdst_22;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> vsrc_22;
  undefined1 local_b60 [7];
  bool ret_21;
  vector<double,_std::allocator<double>_> vdst_21;
  vector<double,_std::allocator<double>_> vsrc_21;
  undefined1 local_b28 [7];
  bool ret_20;
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> vdst_20;
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> vsrc_20;
  undefined1 local_af0 [7];
  bool ret_19;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> vdst_19;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> vsrc_19;
  undefined1 local_ab8 [7];
  bool ret_18;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vdst_18;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vsrc_18;
  undefined1 local_a80 [7];
  bool ret_17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vdst_17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vsrc_17;
  undefined1 local_a48 [7];
  bool ret_16;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> vdst_16;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> vsrc_16;
  undefined1 local_a10 [7];
  bool ret_15;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> vdst_15;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> vsrc_15;
  undefined1 local_9d8 [7];
  bool ret_14;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> vdst_14;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> vsrc_14;
  undefined1 local_9a0 [7];
  bool ret_13;
  vector<int,_std::allocator<int>_> vdst_13;
  vector<int,_std::allocator<int>_> vsrc_13;
  undefined1 local_968 [7];
  bool ret_12;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  vdst_12;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  vsrc_12;
  undefined1 local_930 [7];
  bool ret_11;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  vdst_11;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  vsrc_11;
  undefined1 local_8f8 [7];
  bool ret_10;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  vdst_10;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  vsrc_10;
  undefined1 local_8c0 [7];
  bool ret_9;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> vdst_9;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> vsrc_9;
  undefined1 local_888 [7];
  bool ret_8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vdst_8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vsrc_8;
  undefined1 local_850 [7];
  bool ret_7;
  vector<short,_std::allocator<short>_> vdst_7;
  vector<short,_std::allocator<short>_> vsrc_7;
  undefined1 local_818 [7];
  bool ret_6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vdst_6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vsrc_6;
  undefined1 local_7e0 [7];
  bool ret_5;
  vector<signed_char,_std::allocator<signed_char>_> vdst_5;
  vector<signed_char,_std::allocator<signed_char>_> vsrc_5;
  undefined1 local_7a8 [7];
  bool ret_4;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> vdst_4;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> vsrc_4;
  undefined1 local_770 [7];
  bool ret_3;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> vdst_3;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> vsrc_3;
  undefined1 local_738 [7];
  bool ret_2;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> vdst_2;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> vsrc_2;
  undefined1 local_700 [7];
  bool ret_1;
  vector<float,_std::allocator<float>_> vdst_1;
  vector<float,_std::allocator<float>_> vsrc_1;
  undefined1 local_6c8 [7];
  bool ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vdst;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vsrc;
  ostringstream local_678 [8];
  ostringstream ss_e_3;
  string local_500 [32];
  ostringstream local_4e0 [8];
  ostringstream ss_e_2;
  string local_368 [32];
  ostringstream local_348 [8];
  ostringstream ss_e_1;
  string local_1d0 [32];
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  float eps_local;
  string *err_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  VertexAttribute *dst_local;
  VertexAttribute *src_local;
  
  if (dst == (VertexAttribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"TryConvertFacevaryingToVertex");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2b4);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"Output `dst` is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1d0);
      ::std::__cxx11::string::~string(local_1d0);
    }
    src_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  else {
    bVar1 = VertexAttribute::is_facevarying(src);
    if (bVar1) {
      sVar3 = VertexAttribute::element_size(src);
      if (sVar3 == 1) {
        if (src->stride != 0) {
          sVar3 = VertexAttribute::stride_bytes(src);
          sVar4 = VertexAttribute::format_size(src);
          if (sVar3 != sVar4) {
            ::std::__cxx11::ostringstream::ostringstream(local_678);
            poVar2 = ::std::operator<<((ostream *)local_678,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"TryConvertFacevaryingToVertex");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2c2);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_678,
                                       "Input attribute must be tightly packed. stride_bytes = ");
            sVar3 = VertexAttribute::stride_bytes(src);
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,sVar3);
            poVar2 = ::std::operator<<(poVar2,", format_size = ");
            sVar3 = VertexAttribute::format_size(src);
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,sVar3);
            ::std::operator<<(poVar2,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=
                        ((string *)err,
                         (string *)
                         &vsrc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vsrc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_678);
            return false;
          }
        }
        if (src->format == Bool) {
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &vdst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &vdst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,sVar3);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &vdst.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(puVar5,puVar7,sVar8);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6c8);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexInt<unsigned_char>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &vdst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6c8,
                          faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6c8);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6c8);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,puVar7,sVar8);
          }
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6c8);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &vdst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Float) {
          ::std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)
                     &vdst_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     &vdst_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,sVar3);
          pfVar9 = ::std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)
                              &vdst_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pfVar9,puVar5,sVar8);
          ::std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_700);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<float,float>
                         ((vector<float,_std::allocator<float>_> *)
                          &vdst_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (vector<float,_std::allocator<float>_> *)local_700,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<float,_std::allocator<float>_>::size
                              ((vector<float,_std::allocator<float>_> *)local_700);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pfVar9 = ::std::vector<float,_std::allocator<float>_>::data
                               ((vector<float,_std::allocator<float>_> *)local_700);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pfVar9,sVar8);
          }
          ::std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_700);
          ::std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     &vdst_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Vec2) {
          ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                    ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     &vdst_2.
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::resize
                    ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     &vdst_2.
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar10 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ::data((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)&vdst_2.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar10,puVar5,sVar8);
          ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                    ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     local_738);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<float,2ul>,float>
                         ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           *)&vdst_2.
                              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           *)local_738,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ::size((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)local_738);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar10 = ::std::
                      vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::data
                                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                  *)local_738);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar10,sVar8);
          }
          ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                    ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     local_738);
          ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                    ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     &vdst_2.
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Vec3) {
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &vdst_3.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &vdst_3.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar11 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vdst_3.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar11,puVar5,sVar8);
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     local_770);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<float,3ul>,float>
                         ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           *)&vdst_3.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           *)local_770,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)local_770);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar11 = ::std::
                      vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::data
                                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  *)local_770);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar11,sVar8);
          }
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     local_770);
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &vdst_3.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Vec4) {
          ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                    ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     &vdst_4.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::resize
                    ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     &vdst_4.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar12 = ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ::data((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                            *)&vdst_4.
                               super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar12,puVar5,sVar8);
          ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                    ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     local_7a8);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<float,4ul>,float>
                         ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                           *)&vdst_4.
                              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                           *)local_7a8,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ::size((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                            *)local_7a8);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar12 = ::std::
                      vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::data
                                ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                  *)local_7a8);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar12,sVar8);
          }
          ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
                    ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     local_7a8);
          ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
                    ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     &vdst_4.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Char) {
          ::std::vector<signed_char,_std::allocator<signed_char>_>::vector
                    ((vector<signed_char,_std::allocator<signed_char>_> *)
                     &vdst_5.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<signed_char,_std::allocator<signed_char>_>::resize
                    ((vector<signed_char,_std::allocator<signed_char>_> *)
                     &vdst_5.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,sVar3);
          pcVar13 = ::std::vector<signed_char,_std::allocator<signed_char>_>::data
                              ((vector<signed_char,_std::allocator<signed_char>_> *)
                               &vdst_5.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pcVar13,puVar5,sVar8);
          ::std::vector<signed_char,_std::allocator<signed_char>_>::vector
                    ((vector<signed_char,_std::allocator<signed_char>_> *)local_7e0);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexInt<signed_char>
                         ((vector<signed_char,_std::allocator<signed_char>_> *)
                          &vdst_5.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<signed_char,_std::allocator<signed_char>_> *)local_7e0,
                          faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<signed_char,_std::allocator<signed_char>_>::size
                              ((vector<signed_char,_std::allocator<signed_char>_> *)local_7e0);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pcVar13 = ::std::vector<signed_char,_std::allocator<signed_char>_>::data
                                ((vector<signed_char,_std::allocator<signed_char>_> *)local_7e0);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pcVar13,sVar8);
          }
          ::std::vector<signed_char,_std::allocator<signed_char>_>::~vector
                    ((vector<signed_char,_std::allocator<signed_char>_> *)local_7e0);
          ::std::vector<signed_char,_std::allocator<signed_char>_>::~vector
                    ((vector<signed_char,_std::allocator<signed_char>_> *)
                     &vdst_5.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Byte) {
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &vdst_6.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &vdst_6.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &vdst_6.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(puVar5,puVar7,sVar8);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexInt<unsigned_char>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &vdst_6.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,
                          faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,puVar7,sVar8);
          }
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &vdst_6.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Short) {
          ::std::vector<short,_std::allocator<short>_>::vector
                    ((vector<short,_std::allocator<short>_> *)
                     &vdst_7.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<short,_std::allocator<short>_>::resize
                    ((vector<short,_std::allocator<short>_> *)
                     &vdst_7.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,sVar3);
          psVar14 = ::std::vector<short,_std::allocator<short>_>::data
                              ((vector<short,_std::allocator<short>_> *)
                               &vdst_7.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(psVar14,puVar5,sVar8);
          ::std::vector<short,_std::allocator<short>_>::vector
                    ((vector<short,_std::allocator<short>_> *)local_850);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexInt<short>
                         ((vector<short,_std::allocator<short>_> *)
                          &vdst_7.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (vector<short,_std::allocator<short>_> *)local_850,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<short,_std::allocator<short>_>::size
                              ((vector<short,_std::allocator<short>_> *)local_850);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            psVar14 = ::std::vector<short,_std::allocator<short>_>::data
                                ((vector<short,_std::allocator<short>_> *)local_850);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,psVar14,sVar8);
          }
          ::std::vector<short,_std::allocator<short>_>::~vector
                    ((vector<short,_std::allocator<short>_> *)local_850);
          ::std::vector<short,_std::allocator<short>_>::~vector
                    ((vector<short,_std::allocator<short>_> *)
                     &vdst_7.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Ushort) {
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &vdst_8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &vdst_8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          puVar15 = ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                               &vdst_8.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(puVar15,puVar5,sVar8);
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_888);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexInt<unsigned_short>
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          &vdst_8.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_888,
                          faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_888)
            ;
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            puVar15 = ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                 local_888);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,puVar15,sVar8);
          }
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_888);
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &vdst_8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Half) {
          ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                    ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &vdst_9.
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                    ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &vdst_9.
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          phVar16 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                    data((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         &vdst_9.
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(phVar16,puVar5,sVar8);
          ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                    ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     local_8c0);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<tinyusdz::value::half,float>
                         ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                          &vdst_9.
                           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                          local_8c0,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                    size((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         local_8c0);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            phVar16 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                      data((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                           local_8c0);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,phVar16,sVar8);
          }
          ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                    ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     local_8c0);
          ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                    ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &vdst_9.
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Half2) {
          ::std::
          vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
          ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&vdst_10.
                       super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::
          vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
          ::resize((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&vdst_10.
                       super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar17 = ::std::
                    vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    ::data((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                            *)&vdst_10.
                               super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar17,puVar5,sVar8);
          ::std::
          vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
          ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)local_8f8);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,2ul>,float>
                         ((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                           *)&vdst_10.
                              super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                           *)local_8f8,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    ::size((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                            *)local_8f8);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar17 = ::std::
                      vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      ::data((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                              *)local_8f8);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar17,sVar8);
          }
          ::std::
          vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
          ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     *)local_8f8);
          ::std::
          vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
          ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     *)&vdst_10.
                        super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Half3) {
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&vdst_11.
                       super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&vdst_11.
                       super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar18 = ::std::
                    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ::data((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)&vdst_11.
                               super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar18,puVar5,sVar8);
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)local_930);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,3ul>,float>
                         ((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           *)&vdst_11.
                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           *)local_930,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)local_930);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar18 = ::std::
                      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ::data((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              *)local_930);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar18,sVar8);
          }
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *)local_930);
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *)&vdst_11.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Half4) {
          ::std::
          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
          ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&vdst_12.
                       super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::
          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
          ::resize((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&vdst_12.
                       super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar19 = ::std::
                    vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    ::data((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                            *)&vdst_12.
                               super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar19,puVar5,sVar8);
          ::std::
          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
          ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)local_968);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,4ul>,float>
                         ((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                           *)&vdst_12.
                              super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                           *)local_968,faceVertexIndices,eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    ::size((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                            *)local_968);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar19 = ::std::
                      vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      ::data((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                              *)local_968);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar19,sVar8);
          }
          ::std::
          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
          ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     *)local_968);
          ::std::
          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
          ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     *)&vdst_12.
                        super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Int) {
          ::std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)
                     &vdst_13.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)
                     &vdst_13.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,sVar3);
          piVar20 = ::std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)
                               &vdst_13.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(piVar20,puVar5,sVar8);
          ::std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_9a0);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexInt<int>
                         ((vector<int,_std::allocator<int>_> *)
                          &vdst_13.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)local_9a0,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_9a0);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            piVar20 = ::std::vector<int,_std::allocator<int>_>::data
                                ((vector<int,_std::allocator<int>_> *)local_9a0);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,piVar20,sVar8);
          }
          ::std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_9a0);
          ::std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     &vdst_13.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Ivec2) {
          ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
                    ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                     &vdst_14.
                      super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::resize
                    ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                     &vdst_14.
                      super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar21 = ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
                    data((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                         &vdst_14.
                          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar21,puVar5,sVar8);
          ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
                    ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                     local_9d8);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,2ul>>
                         ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                          &vdst_14.
                           super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                          local_9d8,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
                    size((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                         local_9d8);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar21 = ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
                      data((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                           local_9d8);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar21,sVar8);
          }
          ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
                    ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                     local_9d8);
          ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
                    ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                     &vdst_14.
                      super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Ivec3) {
          ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     &vdst_15.
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::resize
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     &vdst_15.
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar22 = ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                    data((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                         &vdst_15.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar22,puVar5,sVar8);
          ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     local_a10);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,3ul>>
                         ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                          &vdst_15.
                           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                          local_a10,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                    size((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                         local_a10);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar22 = ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                      data((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                           local_a10);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar22,sVar8);
          }
          ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     local_a10);
          ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     &vdst_15.
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Ivec4) {
          ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
                    ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                     &vdst_16.
                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
                    ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                     &vdst_16.
                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar23 = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                    data((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                         &vdst_16.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar23,puVar5,sVar8);
          ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
                    ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                     local_a48);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,4ul>>
                         ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                          &vdst_16.
                           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                          local_a48,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                    size((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                         local_a48);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar23 = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                      data((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                           local_a48);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar23,sVar8);
          }
          ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
                    ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                     local_a48);
          ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
                    ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                     &vdst_16.
                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Uint) {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vdst_17.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vdst_17.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          puVar24 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vdst_17.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(puVar24,puVar5,sVar8);
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexInt<unsigned_int>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &vdst_17.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80,
                          faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            puVar24 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,puVar24,sVar8);
          }
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80);
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vdst_17.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Uvec2) {
          ::std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)&vdst_18.
                     super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          resize((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)&vdst_18.
                     super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar25 = ::std::
                    vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ::data((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                            *)&vdst_18.
                               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar25,puVar5,sVar8);
          ::std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)local_ab8);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<unsigned_int,2ul>>
                         ((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                           *)&vdst_18.
                              super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                           *)local_ab8,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ::size((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                            *)local_ab8);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar25 = ::std::
                      vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ::data((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                              *)local_ab8);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar25,sVar8);
          }
          ::std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          ~vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   *)local_ab8);
          ::std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          ~vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   *)&vdst_18.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Uvec3) {
          ::std::
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
          vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)&vdst_19.
                     super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
          resize((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)&vdst_19.
                     super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar26 = ::std::
                    vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                    ::data((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            *)&vdst_19.
                               super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar26,puVar5,sVar8);
          ::std::
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
          vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)local_af0);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<unsigned_int,3ul>>
                         ((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                           *)&vdst_19.
                              super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                           *)local_af0,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                    ::size((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            *)local_af0);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar26 = ::std::
                      vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      ::data((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                              *)local_af0);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar26,sVar8);
          }
          ::std::
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
          ~vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)local_af0);
          ::std::
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
          ~vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)&vdst_19.
                      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Uvec4) {
          ::std::
          vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
          vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)&vdst_20.
                     super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::
          vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
          resize((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)&vdst_20.
                     super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar27 = ::std::
                    vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    ::data((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                            *)&vdst_20.
                               super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar27,puVar5,sVar8);
          ::std::
          vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
          vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)local_b28);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<unsigned_int,4ul>>
                         ((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                           *)&vdst_20.
                              super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                           *)local_b28,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    ::size((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                            *)local_b28);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar27 = ::std::
                      vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      ::data((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                              *)local_b28);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar27,sVar8);
          }
          ::std::
          vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
          ~vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                   *)local_b28);
          ::std::
          vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
          ~vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                   *)&vdst_20.
                      super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Double) {
          ::std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)
                     &vdst_21.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     &vdst_21.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,sVar3);
          pdVar28 = ::std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)
                               &vdst_21.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pdVar28,puVar5,sVar8);
          ::std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_b60);
          src_local._7_1_ =
               (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<double,double>
                         ((vector<double,_std::allocator<double>_> *)
                          &vdst_21.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (vector<double,_std::allocator<double>_> *)local_b60,faceVertexIndices,
                          (double)eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)local_b60);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pdVar28 = ::std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)local_b60);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pdVar28,sVar8);
          }
          ::std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)local_b60);
          ::std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)
                     &vdst_21.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Dvec2) {
          ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &vdst_22.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &vdst_22.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar29 = ::std::
                    vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::data
                              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                *)&vdst_22.
                                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar29,puVar5,sVar8);
          ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_b98);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<double,2ul>,double>
                         ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                           *)&vdst_22.
                              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                           *)local_b98,faceVertexIndices,(double)eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size
                              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                *)local_b98);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar29 = ::std::
                      vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                      data((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                            *)local_b98);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar29,sVar8);
          }
          ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_b98);
          ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &vdst_22.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Dvec3) {
          ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                    ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     &vdst_23.
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
                    ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     &vdst_23.
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar30 = ::std::
                    vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::data
                              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                *)&vdst_23.
                                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar30,puVar5,sVar8);
          ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                    ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     local_bd0);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<double,3ul>,double>
                         ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                           *)&vdst_23.
                              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                           *)local_bd0,faceVertexIndices,(double)eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::size
                              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                *)local_bd0);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar30 = ::std::
                      vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                      data((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                            *)local_bd0);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar30,sVar8);
          }
          ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                    ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     local_bd0);
          ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                    ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     &vdst_23.
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Dvec4) {
          ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                    ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     &vdst_24.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
                    ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     &vdst_24.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          paVar31 = ::std::
                    vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::data
                              ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                *)&vdst_24.
                                   super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(paVar31,puVar5,sVar8);
          ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                    ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     local_c08);
          src_local._7_1_ =
               (anonymous_namespace)::
               TryConvertFacevaryingToVertexFloat<std::array<double,4ul>,double>
                         ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                           *)&vdst_24.
                              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                           *)local_c08,faceVertexIndices,(double)eps);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::size
                              ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                *)local_c08);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            paVar31 = ::std::
                      vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
                      data((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                            *)local_c08);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,paVar31,sVar8);
          }
          ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::~vector
                    ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     local_c08);
          ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::~vector
                    ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     &vdst_24.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Mat2) {
          ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
          vector((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 &vdst_25.
                  super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
          resize((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 &vdst_25.
                  super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          pmVar32 = ::std::
                    vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
                    data((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                          *)&vdst_25.
                             super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pmVar32,puVar5,sVar8);
          ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
          vector((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 local_c40);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix2f>
                         ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                           *)&vdst_25.
                              super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                           *)local_c40,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
                    size((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                          *)local_c40);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pmVar32 = ::std::
                      vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                      ::data((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                              *)local_c40);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pmVar32,sVar8);
          }
          ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
          ~vector((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                  local_c40);
          ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
          ~vector((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                  &vdst_25.
                   super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Mat3) {
          ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
          vector((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 &vdst_26.
                  super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
          resize((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 &vdst_26.
                  super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          pmVar33 = ::std::
                    vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
                    data((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                          *)&vdst_26.
                             super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pmVar33,puVar5,sVar8);
          ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
          vector((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 local_c78);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix3f>
                         ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                           *)&vdst_26.
                              super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                           *)local_c78,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
                    size((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                          *)local_c78);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pmVar33 = ::std::
                      vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                      ::data((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                              *)local_c78);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pmVar33,sVar8);
          }
          ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
          ~vector((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                  local_c78);
          ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
          ~vector((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                  &vdst_26.
                   super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Mat4) {
          ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
          vector((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 &vdst_27.
                  super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
          resize((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 &vdst_27.
                  super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          pmVar34 = ::std::
                    vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
                    data((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                          *)&vdst_27.
                             super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pmVar34,puVar5,sVar8);
          ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
          vector((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 local_cb0);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix4f>
                         ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                           *)&vdst_27.
                              super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                           *)local_cb0,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
                    size((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                          *)local_cb0);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pmVar34 = ::std::
                      vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                      ::data((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                              *)local_cb0);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pmVar34,sVar8);
          }
          ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
          ~vector((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                  local_cb0);
          ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
          ~vector((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                  &vdst_27.
                   super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Dmat2) {
          ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
          vector((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 &vdst_28.
                  super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
          resize((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 &vdst_28.
                  super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          pmVar35 = ::std::
                    vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
                    data((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                          *)&vdst_28.
                             super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pmVar35,puVar5,sVar8);
          ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
          vector((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 local_ce8);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix2d>
                         ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                           *)&vdst_28.
                              super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                           *)local_ce8,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
                    size((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                          *)local_ce8);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pmVar35 = ::std::
                      vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                      ::data((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                              *)local_ce8);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pmVar35,sVar8);
          }
          ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
          ~vector((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                  local_ce8);
          ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
          ~vector((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                  &vdst_28.
                   super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Dmat3) {
          ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
          vector((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 &vdst_29.
                  super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
          resize((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 &vdst_29.
                  super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          pmVar36 = ::std::
                    vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
                    data((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                          *)&vdst_29.
                             super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pmVar36,puVar5,sVar8);
          ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
          vector((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 local_d20);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix3d>
                         ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                           *)&vdst_29.
                              super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                           *)local_d20,faceVertexIndices);
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
                    size((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                          *)local_d20);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pmVar36 = ::std::
                      vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                      ::data((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                              *)local_d20);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pmVar36,sVar8);
          }
          ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
          ~vector((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                  local_d20);
          ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
          ~vector((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                  &vdst_29.
                   super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (src->format == Dmat4) {
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &vdst_30.
                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar3 = VertexAttribute::vertex_count(src);
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          resize((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &vdst_30.
                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3);
          pmVar37 = ::std::
                    vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                    data((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          *)&vdst_30.
                             super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar6 = VertexAttribute::get_data(src);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          pvVar6 = VertexAttribute::get_data(src);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar6);
          memcpy(pmVar37,puVar5,sVar8);
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_d58);
          src_local._7_1_ =
               TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix4d>
                         ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                           *)&vdst_30.
                              super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                           *)local_d58,faceVertexIndices);
          local_d59 = src_local._7_1_;
          if (src_local._7_1_) {
            ::std::__cxx11::string::operator=((string *)dst,(string *)src);
            dst->elementSize = 1;
            dst->format = src->format;
            dst->variability = Vertex;
            sVar8 = ::std::
                    vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                    size((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          *)local_d58);
            sVar3 = VertexAttribute::format_size(src);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                       sVar8 * sVar3);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data)
            ;
            pmVar37 = ::std::
                      vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ::data((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                              *)local_d58);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
            memcpy(puVar5,pmVar37,sVar8);
          }
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          ~vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                  local_d58);
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          ~vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                  &vdst_30.
                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_da0,"Unsupported/Unimplemented VertexAttributeFormat: {}",&local_da1);
            tydra::to_string_abi_cxx11_(&local_dc8,(tydra *)(ulong)src->format,f);
            fmt::format<std::__cxx11::string>
                      (local_d80,(string *)local_da0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_dc8);
            ::std::__cxx11::string::operator+=((string *)err,(string *)local_d80);
            ::std::__cxx11::string::~string((string *)local_d80);
            ::std::__cxx11::string::~string((string *)&local_dc8);
            ::std::__cxx11::string::~string(local_da0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_da1);
          }
          src_local._7_1_ = false;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4e0);
        poVar2 = ::std::operator<<((ostream *)local_4e0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"TryConvertFacevaryingToVertex");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,700);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_4e0,"Input\'s element_size must be 1.");
        ::std::operator<<(poVar2,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_500);
          ::std::__cxx11::string::~string(local_500);
        }
        src_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_4e0);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_348);
      poVar2 = ::std::operator<<((ostream *)local_348,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"TryConvertFacevaryingToVertex");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2b8);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_348,"Input must be \'facevarying\' attribute");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_368);
        ::std::__cxx11::string::~string(local_368);
      }
      src_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_348);
    }
  }
  return src_local._7_1_;
}

Assistant:

static bool TryConvertFacevaryingToVertex(
    const VertexAttribute &src, VertexAttribute *dst,
    const std::vector<uint32_t> &faceVertexIndices, std::string *err,
    const float eps) {
  DCOUT("TryConvertFacevaryingToVertex");
  if (!dst) {
    PUSH_ERROR_AND_RETURN("Output `dst` is nullptr.");
  }

  if (!src.is_facevarying()) {
    PUSH_ERROR_AND_RETURN("Input must be 'facevarying' attribute");
  }

  if (src.element_size() != 1) {
    PUSH_ERROR_AND_RETURN("Input's element_size must be 1.");
  }

  if ((src.stride != 0) && (src.stride_bytes() != src.format_size())) {
    PUSH_ERROR_AND_RETURN(
        "Input attribute must be tightly packed. stride_bytes = "
        << src.stride_bytes() << ", format_size = " << src.format_size());
  }

#define CONVERT_FUN_INT(__fmt, __ty)                                      \
  if (src.format == __fmt) {                                              \
    std::vector<__ty> vsrc;                                               \
    vsrc.resize(src.vertex_count());                                      \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size());    \
    std::vector<__ty> vdst;                                               \
    bool ret = TryConvertFacevaryingToVertexInt<__ty>(vsrc, &vdst,        \
                                                      faceVertexIndices); \
    if (!ret) {                                                           \
      return false;                                                       \
    }                                                                     \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                                 \
    dst->format = src.format;                                             \
    dst->variability = VertexVariability::Vertex;                         \
    dst->data.resize(vdst.size() * src.format_size());                    \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());              \
    return true;                                                          \
  } else

#define CONVERT_FUN_FLOAT(__fmt, __ty, __epsty)                        \
  if (src.format == __fmt) {                                           \
    std::vector<__ty> vsrc;                                            \
    vsrc.resize(src.vertex_count());                                   \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size()); \
    std::vector<__ty> vdst;                                            \
    bool ret = TryConvertFacevaryingToVertexFloat<__ty, __epsty>(      \
        vsrc, &vdst, faceVertexIndices, __epsty(eps));                 \
    if (!ret) {                                                        \
      return false;                                                    \
    }                                                                  \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                              \
    dst->format = src.format;                                          \
    dst->variability = VertexVariability::Vertex;                      \
    dst->data.resize(vdst.size() * src.format_size());                 \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());           \
    return true;                                                       \
  } else

#define CONVERT_FUN_MAT(__fmt, __ty)                                      \
  if (src.format == __fmt) {                                              \
    std::vector<__ty> vsrc;                                               \
    vsrc.resize(src.vertex_count());                                      \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size());    \
    std::vector<__ty> vdst;                                               \
    bool ret = TryConvertFacevaryingToVertexMat<__ty>(vsrc, &vdst,        \
                                                      faceVertexIndices); \
    if (!ret) {                                                           \
      return false;                                                       \
    }                                                                     \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                                 \
    dst->format = src.format;                                             \
    dst->variability = VertexVariability::Vertex;                         \
    dst->data.resize(vdst.size() * src.format_size());                    \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());              \
    return true;                                                          \
  } else

  // NOTE: VertexAttributeFormat::Bool is preserved
  CONVERT_FUN_INT(VertexAttributeFormat::Bool, uint8_t)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Float, float, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec2, value::float2, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec3, value::float3, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec4, value::float4, float)
  CONVERT_FUN_INT(VertexAttributeFormat::Char, signed char)
  // CONVERT_FUN(VertexAttributeFormat::Char2, value::char2)
  // CONVERT_FUN(VertexAttributeFormat::Char3, value::char3)
  // CONVERT_FUN(VertexAttributeFormat::Char4,    // int8x4
  CONVERT_FUN_INT(VertexAttributeFormat::Byte, uint8_t)
  // CONVERT_FUN(VertexAttributeFormat::Byte2,    // uint8x2
  // CONVERT_FUN(VertexAttributeFormat::Byte3,    // uint8x3
  // CONVERT_FUN(VertexAttributeFormat::Byte4,    // uint8x4
  CONVERT_FUN_INT(VertexAttributeFormat::Short, int16_t)
  // CONVERT_FUN(VertexAttributeFormat::Short2, value::short2)
  // CONVERT_FUN(VertexAttributeFormat::Short3, value::short3)
  // CONVERT_FUN(VertexAttributeFormat::Short4, value::short4)
  CONVERT_FUN_INT(VertexAttributeFormat::Ushort, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort2, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort3, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort4, uint16_t)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half, value::half, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half2, value::half2, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half3, value::half3, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half4, value::half4, float)
  CONVERT_FUN_INT(VertexAttributeFormat::Int, int)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec2, value::int2)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec3, value::int3)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec4, value::int4)
  CONVERT_FUN_INT(VertexAttributeFormat::Uint, uint32_t)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec2, value::uint2)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec3, value::uint3)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec4, value::uint4)
  // NOTE: Use float precision eps is upcasted to double precision.
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Double, double, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec2, value::double2, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec3, value::double3, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec4, value::double4, double)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat2, value::matrix2f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat3, value::matrix3f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat4, value::matrix4f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat2, value::matrix2d)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat3, value::matrix3d)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat4, value::matrix4d) {
    if (err) {
      (*err) +=
          fmt::format("Unsupported/Unimplemented VertexAttributeFormat: {}",
                      to_string(src.format));
    }
  }

#undef CONVERT_FUN_INT
#undef CONVERT_FUN_FLOAT
#undef CONVERT_FUN_MAT

  return false;
}